

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

void aes_schedule(cf_aes_context *ctx,uint8_t *key,size_t nkey)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint32_t *puVar7;
  int iVar8;
  ulong uVar9;
  
  uVar9 = nkey >> 2;
  uVar3 = (ulong)(ctx->rounds + 1);
  uVar4 = 0;
  if (3 < nkey) {
    do {
      uVar5 = *(uint *)(key + uVar4 * 4);
      ctx->ks[uVar4] =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar4 = uVar4 + 1;
    } while (uVar9 != uVar4);
  }
  lVar6 = uVar4 + uVar3 * -4;
  if (uVar4 < uVar3 * 4) {
    uVar5 = 1;
    uVar3 = 0;
    puVar1 = ctx->ks + (uVar4 - 1);
    do {
      puVar7 = puVar1 + 1;
      uVar2 = *puVar1;
      iVar8 = (int)uVar3;
      if (uVar9 == uVar3) {
        iVar8 = 0;
      }
      uVar5 = (uVar9 == uVar3) + uVar5;
      if (iVar8 == 0) {
        uVar2 = sub_word(uVar2 << 8 | uVar2 >> 0x18,S);
        uVar2 = (uint)Rcon[uVar5] << 0x18 ^ uVar2;
      }
      else if ((0x1b < nkey) && (iVar8 == 4)) {
        uVar2 = sub_word(uVar2,S);
      }
      *puVar7 = uVar2 ^ puVar7[-uVar9];
      uVar3 = (ulong)(iVar8 + 1);
      lVar6 = lVar6 + 1;
      puVar1 = puVar7;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

static void aes_schedule(cf_aes_context *ctx, const uint8_t *key, size_t nkey)
{
  size_t i,
         nb = AES_BLOCKSZ / 4,
         nk = nkey / 4,
         n = nb * (ctx->rounds + 1);
  uint32_t *w = ctx->ks;

  /* First words are just the key. */
  for (i = 0; i < nk; i++)
  {
    w[i] = read32_be(key + i * 4);
  }

  uint32_t i_div_nk = 1;
  uint32_t i_mod_nk = 0;

  for (; i < n; i++, i_mod_nk++)
  {
    uint32_t temp = w[i - 1];
    
    if (i_mod_nk == nk)
    {
      i_div_nk++;
      i_mod_nk = 0;
    }

    if (i_mod_nk == 0)
      temp = sub_word(rot_word(temp), S) ^ round_constant(i_div_nk);
    else if (nk > 6 && i_mod_nk == 4)
      temp = sub_word(temp, S);

    w[i] = w[i - nk] ^ temp;
  }
}